

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamWriterPrivate::indent(QXmlStreamWriterPrivate *this,int level)

{
  char *len;
  size_t in_RCX;
  undefined1 *__n;
  int in_ESI;
  QXmlStreamWriterPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  qsizetype in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  QAnyStringView *in_stack_ffffffffffffff90;
  int local_58;
  undefined1 local_28 [8];
  void *local_20;
  int local_18 [2];
  void *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(ushort *)&in_RDI->field_0x78 >> 8 & 1) != 0) ||
     ((*(ushort *)&in_RDI->field_0x78 >> 9 & 1) != 0)) {
    in_stack_ffffffffffffff88 = local_18;
    in_stack_ffffffffffffff90 = (QAnyStringView *)std::data<char_const,2ul>((char (*) [2])0x938dd4);
    QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64d6d5);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80
              );
    write(in_RDI,local_18[0],local_10,in_RCX);
  }
  for (local_58 = 0; local_58 < in_ESI; local_58 = local_58 + 1) {
    __n = local_28;
    len = std::data<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x64d74f);
    QtPrivate::lengthHelperContainer<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x64d75e);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,(qsizetype)len);
    write(in_RDI,local_28._0_4_,local_20,(size_t)__n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriterPrivate::indent(int level)
{
    if (didWriteStartDocument || didWriteAnyToken)
        write("\n");
    for (int i = 0; i < level; ++i)
        write(autoFormattingIndent);
}